

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlite_lib_config(int nConfigOp,...)

{
  unqlite_vfs *pMethods;
  char in_AL;
  undefined8 in_RCX;
  uint uVar1;
  uint uVar2;
  undefined8 in_RDX;
  sxi32 sVar3;
  ProcMemError in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  sxi32 sStack_e0;
  va_list ap;
  undefined1 local_c0 [16];
  unqlite_vfs *local_b0;
  void *local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  pMethods = local_b0;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  if (sUnqlMPGlobal.nMagic == 0xea1495ba) {
    return -4;
  }
  sVar3 = 0;
  sStack_e0 = 0;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  switch(nConfigOp) {
  case 1:
    if (local_b0 == (unqlite_vfs *)0x0) {
      local_b0 = (unqlite_vfs *)in_RSI;
      local_a8 = (void *)in_RDX;
      SyMemBackendInit(&sUnqlMPGlobal.sAllocator,sUnqlMPGlobal.sAllocator.xMemError,
                       sUnqlMPGlobal.sAllocator.pUserData);
      sStack_e0 = sVar3;
    }
    else {
      local_b0 = (unqlite_vfs *)in_RSI;
      local_a8 = (void *)in_RDX;
      sStack_e0 = SyMemBackendInitFromOthers
                            (&sUnqlMPGlobal.sAllocator,(SyMemMethods *)pMethods,
                             sUnqlMPGlobal.sAllocator.xMemError,sUnqlMPGlobal.sAllocator.pUserData);
    }
    break;
  case 2:
    sUnqlMPGlobal.sAllocator.pUserData = local_a8;
    sUnqlMPGlobal.sAllocator.xMemError = in_RSI;
    uVar1 = sUnqlMPGlobal.iPageSize;
    goto LAB_0010ad8e;
  case 3:
  case 4:
  case 5:
    break;
  case 6:
    sStack_e0 = sVar3;
    if (local_b0 != (unqlite_vfs *)0x0) {
      sUnqlMPGlobal.pVfs = local_b0;
    }
    break;
  case 7:
    sStack_e0 = -9;
    if ((((((local_b0 != (unqlite_vfs *)0x0) && (local_b0->zName != (char *)0x0)) &&
          (*local_b0->zName != '\0')) &&
         ((local_b0->xGetLastError != (_func_int_unqlite_vfs_ptr_int_char_ptr *)0x0 &&
          (local_b0[1].xCurrentTime != (_func_int_unqlite_vfs_ptr_Sytm_ptr *)0x0)))) &&
        ((local_b0[1].xTmpDir != (_func_int_unqlite_vfs_ptr_char_ptr_int *)0x0 &&
         ((local_b0[1].xSleep != (_func_int_unqlite_vfs_ptr_int *)0x0 &&
          (local_b0[1].xFullPathname != (_func_int_unqlite_vfs_ptr_char_ptr_int_char_ptr *)0x0))))))
       && (7 < local_b0->iVersion)) {
      local_b0 = (unqlite_vfs *)in_RSI;
      local_a8 = (void *)in_RDX;
      sStack_e0 = SySetPut(&sUnqlMPGlobal.kv_storage,local_c0);
    }
    break;
  case 8:
    if (0xfe00 < (uint)local_b0 - 0x200) {
      return -9;
    }
    uVar1 = (uint)local_b0 - ((uint)local_b0 >> 1 & 0x55555555);
    uVar2 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0x33333333);
    uVar1 = (uint)local_b0;
    if (1 < ((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18) {
      return -9;
    }
LAB_0010ad8e:
    sUnqlMPGlobal.iPageSize = uVar1;
    sStack_e0 = 0;
    break;
  default:
    sStack_e0 = -0x18;
  }
  return sStack_e0;
}

Assistant:

int unqlite_lib_config(int nConfigOp,...)
{
	va_list ap;
	int rc;
	if( sUnqlMPGlobal.nMagic == UNQLITE_LIB_MAGIC ){
		/* Library is already initialized, this operation is forbidden */
		return UNQLITE_LOCKED;
	}
	va_start(ap,nConfigOp);
	rc = unqliteCoreConfigure(nConfigOp,ap);
	va_end(ap);
	return rc;
}